

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

QString * styleStringHelper(QString *__return_storage_ptr__,int weight,Style style)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  QArrayData *pQVar5;
  undefined8 uVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  int iVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  QArrayData *local_88;
  char16_t *pcStack_80;
  qsizetype local_78;
  QStringBuilder<char16_t,_QString> local_68;
  QString local_48;
  QString *local_28;
  
  local_28 = *(QString **)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  if (weight < 0x191) {
    if (weight < 0x65) {
      pcVar10 = "Thin";
      goto LAB_00494bc1;
    }
    if ((uint)weight < 0xc9) {
      pcVar10 = "Extra Light";
      goto LAB_00494bc1;
    }
    if ((uint)weight < 0x12d) {
      pcVar10 = "Light";
      goto LAB_00494bc1;
    }
  }
  else {
    if ((uint)weight < 900) {
      if (799 < (uint)weight) {
        pcVar10 = "Extra Bold";
        goto LAB_00494bc1;
      }
      if (699 < (uint)weight) {
        pcVar10 = "Bold";
        goto LAB_00494bc1;
      }
      if (599 < (uint)weight) {
        pcVar10 = "Demi Bold";
        goto LAB_00494bc1;
      }
      if ((uint)weight < 500) goto LAB_00494be8;
      pcVar10 = "Medium";
      iVar9 = 0x6a7f03;
    }
    else {
      pcVar10 = "Black";
LAB_00494bc1:
      iVar9 = 0;
    }
    QCoreApplication::translate((char *)&local_68,"QFontDatabase",pcVar10,iVar9);
    local_48.d.d = (Data *)local_68._0_8_;
    local_48.d.ptr = (char16_t *)local_68.b.d.d;
    local_48.d.size = (qsizetype)local_68.b.d.ptr;
  }
LAB_00494be8:
  if (style == StyleOblique) {
    pcVar10 = "Oblique";
  }
  else {
    if (style != StyleItalic) goto LAB_00494ca2;
    pcVar10 = "Italic";
  }
  QCoreApplication::translate((char *)&local_88,"QFontDatabase",pcVar10,0);
  local_68.b.d.size = local_78;
  local_68.b.d.ptr = pcStack_80;
  local_68.b.d.d = (Data *)local_88;
  local_68.a = 0x20;
  local_88 = (QArrayData *)0x0;
  pcStack_80 = (char16_t *)0x0;
  local_78 = 0;
  operator+=(&local_48,&local_68);
  if (&(local_68.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.b.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
LAB_00494ca2:
  if ((char16_t *)local_48.d.size == (char16_t *)0x0) {
    QCoreApplication::translate((char *)&local_68,"QFontDatabase","Normal",0x6a7ed0);
    pcVar8 = local_48.d.ptr;
    pDVar7 = local_48.d.d;
    pcVar2 = local_68.b.d.ptr;
    uVar6 = local_68._0_8_;
    pQVar1 = &(local_48.d.d)->super_QArrayData;
    pQVar3 = (QArrayData *)local_48.d.ptr;
    pcVar4 = (char16_t *)local_48.d.size;
    pQVar5 = (QArrayData *)local_68._0_8_;
    local_48.d.ptr = (char16_t *)local_68.b.d.d;
    local_68._0_8_ = local_48.d.d;
    local_48.d.d = (Data *)uVar6;
    local_68.b.d.d = (Data *)pcVar8;
    local_68.b.d.ptr = (char16_t *)local_48.d.size;
    local_48.d.size = (qsizetype)pcVar2;
    if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
      }
    }
  }
  QString::simplified_helper((QString *)__return_storage_ptr__);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString styleStringHelper(int weight, QFont::Style style)
{
    QString result;
    if (weight > QFont::Normal) {
        if (weight >= QFont::Black)
            result = QCoreApplication::translate("QFontDatabase", "Black");
        else if (weight >= QFont::ExtraBold)
            result = QCoreApplication::translate("QFontDatabase", "Extra Bold");
        else if (weight >= QFont::Bold)
            result = QCoreApplication::translate("QFontDatabase", "Bold");
        else if (weight >= QFont::DemiBold)
            result = QCoreApplication::translate("QFontDatabase", "Demi Bold");
        else if (weight >= QFont::Medium)
            result = QCoreApplication::translate("QFontDatabase", "Medium", "The Medium font weight");
    } else {
        if (weight <= QFont::Thin)
            result = QCoreApplication::translate("QFontDatabase", "Thin");
        else if (weight <= QFont::ExtraLight)
            result = QCoreApplication::translate("QFontDatabase", "Extra Light");
        else if (weight <= QFont::Light)
            result = QCoreApplication::translate("QFontDatabase", "Light");
    }

    if (style == QFont::StyleItalic)
        result += u' ' + QCoreApplication::translate("QFontDatabase", "Italic");
    else if (style == QFont::StyleOblique)
        result += u' ' + QCoreApplication::translate("QFontDatabase", "Oblique");

    if (result.isEmpty())
        result = QCoreApplication::translate("QFontDatabase", "Normal", "The Normal or Regular font weight");

    return result.simplified();
}